

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

void __thiscall glslang::TPpContext::push_include(TPpContext *this,IncludeResult *result)

{
  IncludeResult *local_18;
  IncludeResult *result_local;
  TPpContext *this_local;
  
  local_18 = result;
  result_local = (IncludeResult *)this;
  std::__cxx11::string::operator=((string *)&this->currentSourceFile,(string *)result);
  std::
  stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
  ::push(&this->includeStack,&local_18);
  return;
}

Assistant:

void push_include(TShader::Includer::IncludeResult* result)
    {
        currentSourceFile = result->headerName;
        includeStack.push(result);
    }